

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O3

VectorData *
find_max_min_mean<signed_char>
          (VectorData *__return_storage_ptr__,
          vector<signed_char,_std::allocator<signed_char>_> *numbers)

{
  char *pcVar1;
  char *pcVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  
  pcVar1 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar7 = (double)(int)*pcVar1;
  __return_storage_ptr__->max = dVar7;
  pcVar2 = (numbers->super__Vector_base<signed_char,_std::allocator<signed_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  lVar6 = (long)pcVar2 - (long)pcVar1;
  dVar8 = dVar7;
  dVar5 = dVar7;
  if (lVar6 != 1) {
    while (dVar4 = dVar8, pcVar1 = pcVar1 + 1, pcVar1 != pcVar2) {
      dVar8 = (double)(int)*pcVar1;
      dVar3 = dVar8;
      if (dVar8 <= dVar5) {
        dVar3 = dVar5;
      }
      dVar7 = dVar7 + dVar8;
      dVar5 = dVar3;
      if (dVar4 <= dVar8) {
        dVar8 = dVar4;
      }
    }
    __return_storage_ptr__->max = dVar5;
    auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar9._0_8_ = lVar6;
    auVar9._12_4_ = 0x45300000;
    __return_storage_ptr__->min = dVar4;
    __return_storage_ptr__->mean =
         dVar7 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0));
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->mean = dVar7;
  __return_storage_ptr__->min = dVar7;
  return __return_storage_ptr__;
}

Assistant:

VectorData find_max_min_mean(const std::vector<Number>& numbers)
{
	VectorData vd;

	auto it = numbers.begin();
	vd.max = *it;
	vd.min = *it;
	double sum = *it;

	if (numbers.size() == 1)
	{
		vd.min = vd.mean = vd.max;
		return vd;
	}

	for (it = it + 1; it != numbers.end(); ++it)
	{
		if (vd.max < *it)
			vd.max = *it;
		if (vd.min > * it)
			vd.min = *it;
		sum += *it;
	}

	vd.mean = sum / numbers.size();
	return vd;
}